

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encryptor_test.cpp
# Opt level: O3

void test_key(string *test_dir)

{
  pointer pcVar1;
  long lVar2;
  short *psVar3;
  int *piVar4;
  char *pcVar5;
  ostream *poVar6;
  runtime_error *prVar7;
  key k;
  key k3;
  key k2;
  ostringstream oss;
  key local_1e0 [32];
  key local_1c0 [16];
  key local_1b0 [16];
  key local_1a0 [16];
  undefined1 *local_190 [2];
  undefined1 local_180 [360];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- Testing key",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  cppcms::crypto::key::key(local_1c0);
  cppcms::crypto::key::set_hex((char *)local_1c0,0x10b6aa);
  lVar2 = cppcms::crypto::key::size();
  if (lVar2 != 2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
               ,0x61);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_190,0xa4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," k.size()==2",0xc);
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar7,(string *)local_1e0);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  psVar3 = (short *)cppcms::crypto::key::data();
  if (*psVar3 != -0x4456) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
               ,0x61);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_190,0xa5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," memcmp(k.data(),\"\\xaa\\xbb\",2)==0",0x21);
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar7,(string *)local_1e0);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::crypto::key::set(local_1c0,0x10b6aa);
  lVar2 = cppcms::crypto::key::size();
  if (lVar2 != 4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
               ,0x61);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_190,0xa7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," k.size()==4",0xc);
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar7,(string *)local_1e0);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  piVar4 = (int *)cppcms::crypto::key::data();
  if (*piVar4 != 0x62626161) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
               ,0x61);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_190,0xa8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," memcmp(k.data(),\"aabb\",4)==0",0x1d);
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar7,(string *)local_1e0);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_190[0] = local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"ab","");
  cppcms::crypto::key::key(local_1e0,(string *)local_190);
  cppcms::crypto::key::operator=(local_1c0,local_1e0);
  cppcms::crypto::key::~key(local_1e0);
  if (local_190[0] != local_180) {
    operator_delete(local_190[0]);
  }
  lVar2 = cppcms::crypto::key::size();
  if (lVar2 != 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
               ,0x61);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_190,0xaa);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," k.size()==1",0xc);
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar7,(string *)local_1e0);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar5 = (char *)cppcms::crypto::key::data();
  if (*pcVar5 != -0x55) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
               ,0x61);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_190,0xab);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," *k.data()==\'\\xAB\'",0x12);
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar7,(string *)local_1e0);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::crypto::key::key(local_1a0,local_1c0);
  lVar2 = cppcms::crypto::key::size();
  if (lVar2 != 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
               ,0x61);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_190,0xad);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," k2.size()==1",0xd);
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar7,(string *)local_1e0);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar5 = (char *)cppcms::crypto::key::data();
  if (*pcVar5 != -0x55) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
               ,0x61);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_190,0xae);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," *k2.data()==\'\\xAB\'",0x13);
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar7,(string *)local_1e0);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::crypto::key::key(local_1b0);
  lVar2 = cppcms::crypto::key::size();
  if (lVar2 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
               ,0x61);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_190,0xb0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," k3.size()==0",0xd);
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar7,(string *)local_1e0);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cppcms::crypto::key::operator=(local_1b0,local_1c0);
  lVar2 = cppcms::crypto::key::size();
  if (lVar2 != 1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
               ,0x61);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_190,0xb2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," k3.size()==1",0xd);
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar7,(string *)local_1e0);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar5 = (char *)cppcms::crypto::key::data();
  if (*pcVar5 == -0x55) {
    pcVar1 = (test_dir->_M_dataplus)._M_p;
    local_190[0] = local_180;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_190,pcVar1,pcVar1 + test_dir->_M_string_length);
    std::__cxx11::string::append((char *)local_190);
    cppcms::crypto::key::read_from_file((string *)local_1c0);
    if (local_190[0] != local_180) {
      operator_delete(local_190[0]);
    }
    lVar2 = cppcms::crypto::key::size();
    if (lVar2 == 4) {
      piVar4 = (int *)cppcms::crypto::key::data();
      if (*piVar4 == -0x2233fe55) {
        cppcms::crypto::key::~key(local_1b0);
        cppcms::crypto::key::~key(local_1a0);
        cppcms::crypto::key::~key(local_1c0);
        return;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_190,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
                 ,0x61);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_190,0xb6);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6," memcmp(k.data(),\"\\xab\\x01\\xcc\\xdd\",4)==0",0x29);
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar7,(string *)local_1e0);
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
               ,0x61);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_190,0xb5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," k.size()==4",0xc);
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar7,(string *)local_1e0);
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/encryptor_test.cpp"
             ,0x61);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_190,0xb3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," *k3.data()==\'\\xAB\'",0x13);
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar7,(string *)local_1e0);
  __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void test_key(std::string test_dir)
{
	std::cout << "- Testing key" << std::endl;
	cppcms::crypto::key k;
	k.set_hex("aabb",4);
	TEST(k.size()==2);
	TEST(memcmp(k.data(),"\xaa\xbb",2)==0);
	k.set("aabb",4);
	TEST(k.size()==4);
	TEST(memcmp(k.data(),"aabb",4)==0);
	k=cppcms::crypto::key(std::string("ab"));
	TEST(k.size()==1);
	TEST(*k.data()=='\xAB');
	cppcms::crypto::key k2(k);
	TEST(k2.size()==1);
	TEST(*k2.data()=='\xAB');
	cppcms::crypto::key k3;
	TEST(k3.size()==0);
	k3=k;
	TEST(k3.size()==1);
	TEST(*k3.data()=='\xAB');
	k.read_from_file(test_dir+"/sample_key.txt");
	TEST(k.size()==4);
	TEST(memcmp(k.data(),"\xab\x01\xcc\xdd",4)==0);
}